

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  pointer puVar1;
  _Base_ptr p_Var2;
  Column_settings *pCVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  undefined1 *puVar6;
  _List_node_base *p_Var7;
  undefined4 local_694;
  undefined4 *local_690;
  _Base_ptr local_688;
  undefined **local_680;
  ulong local_678;
  shared_count sStack_670;
  undefined4 **local_668;
  undefined8 local_660;
  uint local_658 [2];
  undefined8 *local_650;
  _Base_ptr *local_648;
  undefined1 local_640 [8];
  undefined8 local_638;
  shared_count sStack_630;
  char *local_628;
  char *local_620;
  undefined **local_618;
  char *local_610;
  undefined8 *local_608;
  char *local_600;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>>
            ();
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
              *)&m.matrix_,&columns,m.colSettings_);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
            (&columns,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (m.matrix_.super_RU_vine_swap_option.super_type.barcode_.
      super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl._M_node.super__List_node_base._M_next !=
      (_List_node_base *)&m.matrix_.super_RU_vine_swap_option.super_type.barcode_) {
    p_Var7 = m.matrix_.super_RU_vine_swap_option.super_type.barcode_.
             super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      __args = p_Var7 + 1;
      __args_1 = (uint *)((long)&p_Var7[1]._M_next + 4);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars1,(int *)__args,__args_1,(uint *)&p_Var7[1]._M_prev);
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars2,(int *)__args,__args_1,(uint *)&p_Var7[1]._M_prev);
      local_658[0] = *(uint *)&p_Var7[1]._M_prev;
      local_660 = (undefined **)__args->_M_next;
      std::
      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
      ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                  *)&bars3,(int *)&local_660,(uint *)((long)&local_660 + 4),local_658);
      p_Var7 = p_Var7->_M_next;
    } while (p_Var7 != (_List_node_base *)&m.matrix_.super_RU_vine_swap_option.super_type.barcode_);
  }
  p_Var2 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x574);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_688 = (_Base_ptr)&p_Var2[1]._M_parent;
  local_690 = &local_694;
  local_694 = 0;
  local_640[0] = *(int *)&p_Var2[1]._M_parent == 0;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_648 = &local_688;
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_678 = local_678 & 0xffffffffffffff00;
  local_668 = &local_690;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_310,0x575);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 0;
  local_640[0] = *(int *)&p_Var2[1].field_0x4 == 0;
  local_688 = (_Base_ptr)&p_Var2[1].field_0x4;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_330,0x577);
  local_688 = p_Var2 + 1;
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 0xffffffff;
  local_640[0] = local_688->_M_color == ~_S_red;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x579);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 0;
  local_640[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_688 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x57a);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 1;
  local_640[0] = *(int *)&p_Var5[1].field_0x4 == 1;
  local_688 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_390,0x57b);
  local_688 = p_Var5 + 1;
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 3;
  local_640[0] = local_688->_M_color == 3;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x57d);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 0;
  local_640[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_688 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d0,0x57e);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 2;
  local_640[0] = *(int *)&p_Var5[1].field_0x4 == 2;
  local_688 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3f0,0x57f);
  local_688 = p_Var5 + 1;
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 4;
  local_640[0] = local_688->_M_color == 4;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_410,0x581);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 0;
  local_640[0] = *(int *)&p_Var5[1]._M_parent == 0;
  local_688 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x582);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 7;
  local_640[0] = *(int *)&p_Var5[1].field_0x4 == 7;
  local_688 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_450,0x583);
  local_688 = p_Var5 + 1;
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 8;
  local_640[0] = local_688->_M_color == 8;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_470,0x585);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 1;
  local_640[0] = *(int *)&p_Var5[1]._M_parent == 1;
  local_688 = (_Base_ptr)&p_Var5[1]._M_parent;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_490,0x586);
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 5;
  local_640[0] = *(int *)&p_Var5[1].field_0x4 == 5;
  local_688 = (_Base_ptr)&p_Var5[1].field_0x4;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_630);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4b0,0x587);
  local_688 = p_Var5 + 1;
  local_610 = (char *)((ulong)local_610 & 0xffffffffffffff00);
  local_618 = &PTR__lazy_ostream_0023a238;
  local_608 = &boost::unit_test::lazy_ostream::inst;
  local_600 = "";
  local_694 = 6;
  local_640[0] = local_688->_M_color == 6;
  local_638 = 0;
  sStack_630.pi_ = (sp_counted_base *)0x0;
  local_628 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_620 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a1f8;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = &local_688;
  local_690 = &local_694;
  local_678 = local_678 & 0xffffffffffffff00;
  local_680 = &PTR__lazy_ostream_0023a1f8;
  sStack_670.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_668 = &local_690;
  boost::test_tools::tt_detail::report_assertion
            (local_640,&local_618,&local_628,0x587,1,2,2,"std::get<2>(*it)",&local_660,"6",
             &local_680);
  boost::detail::shared_count::~shared_count(&sStack_630);
  puVar6 = (undefined1 *)std::_Rb_tree_increment(p_Var5);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d0,0x589);
  local_680 = (undefined **)
              CONCAT71(local_680._1_7_,
                       (_Rb_tree_header *)puVar6 == &bars1._M_t._M_impl.super__Rb_tree_header);
  local_678 = 0;
  sStack_670.pi_ = (sp_counted_base *)0x0;
  local_618 = (undefined **)0x1f7583;
  local_610 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a378;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4e8 = "";
  local_648 = (_Base_ptr *)&local_618;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_670);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_500,0x58b);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars2._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_680 = (undefined **)CONCAT71(local_680._1_7_,bVar4);
  local_678 = 0;
  sStack_670.pi_ = (sp_counted_base *)0x0;
  local_618 = (undefined **)0x1f7595;
  local_610 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a378;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_518 = "";
  local_648 = (_Base_ptr *)&local_618;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_670);
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_528 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_530,0x58c);
  if (bars1._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      bars3._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::tuple<int,int,int>>,std::_Rb_tree_const_iterator<std::tuple<int,int,int>>>
                      ((_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       &bars1._M_t._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>)
                       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_680 = (undefined **)CONCAT71(local_680._1_7_,bVar4);
  local_678 = 0;
  sStack_670.pi_ = (sp_counted_base *)0x0;
  local_618 = (undefined **)0x1f75a4;
  local_610 = "";
  local_658[0] = local_658[0] & 0xffffff00;
  local_660 = &PTR__lazy_ostream_0023a378;
  local_650 = &boost::unit_test::lazy_ostream::inst;
  local_648 = (_Base_ptr *)&local_618;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_670);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
  ::reset(&m.matrix_,m.colSettings_);
  pCVar3 = m.colSettings_;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
    operator_delete(pCVar3,0x38);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>_>
  ::~RU_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}